

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_OriginalOrder_Test::TestBody(TApp_OriginalOrder_Test *this)

{
  initializer_list<CLI::Option_*> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  bool bVar1;
  Option *pOVar2;
  char *pcVar3;
  vector<CLI::Option_*,_std::allocator<CLI::Option_*>_> *lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3d8;
  AssertHelper local_318;
  Message local_310;
  allocator<CLI::Option_*> local_301;
  Option *local_300;
  Option *local_2f8;
  Option *local_2f0;
  Option *local_2e8;
  iterator local_2e0;
  size_type local_2d8;
  vector<CLI::Option_*,_std::allocator<CLI::Option_*>_> local_2d0;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_2;
  Message local_2a0;
  allocator<int> local_295;
  int local_294;
  iterator local_290;
  size_type local_288;
  vector<int,_std::allocator<int>_> local_280;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_1;
  Message local_250;
  allocator<int> local_245;
  int local_244 [3];
  iterator local_238;
  size_type local_230;
  vector<int,_std::allocator<int>_> local_228;
  undefined1 local_210 [8];
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  iterator local_110;
  size_type local_108;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  Option *local_b0;
  Option *op2;
  vector<int,_std::allocator<int>_> st2;
  string local_88;
  allocator local_51;
  string local_50;
  Option *local_30;
  Option *op1;
  vector<int,_std::allocator<int>_> st1;
  TApp_OriginalOrder_Test *this_local;
  
  st1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  CLI::std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&op1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"-a",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_88,"",
             (allocator *)
             ((long)&st2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  pOVar2 = CLI::App::add_option<int>
                     (&(this->super_TApp).app,&local_50,(vector<int,_std::allocator<int>_> *)&op1,
                      &local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&st2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_30 = pOVar2;
  CLI::std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&op2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"-b",&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"",&local_f9);
  pOVar2 = CLI::App::add_option<int>
                     (&(this->super_TApp).app,&local_d0,(vector<int,_std::allocator<int>_> *)&op2,
                      &local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  gtest_ar.message_.ptr_._0_1_ = 1;
  local_b0 = pOVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1f0,"-a",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"1",(allocator *)((long)&gtest_ar.message_.ptr_ + 6));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"-b",(allocator *)((long)&gtest_ar.message_.ptr_ + 5));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"2",(allocator *)((long)&gtest_ar.message_.ptr_ + 4));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"-a3",(allocator *)((long)&gtest_ar.message_.ptr_ + 3));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"-a",(allocator *)((long)&gtest_ar.message_.ptr_ + 2));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"4",(allocator *)((long)&gtest_ar.message_.ptr_ + 1));
  gtest_ar.message_.ptr_._0_1_ = 0;
  local_110 = &local_1f0;
  local_108 = 7;
  __l_02._M_len = 7;
  __l_02._M_array = local_110;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l_02);
  local_3d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_110;
  do {
    local_3d8 = local_3d8 + -1;
    std::__cxx11::string::~string((string *)local_3d8);
  } while (local_3d8 != &local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 1));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 4));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  TApp::run(&this->super_TApp);
  local_244[0] = 1;
  local_244[1] = 3;
  local_244[2] = 4;
  local_238 = local_244;
  local_230 = 3;
  CLI::std::allocator<int>::allocator(&local_245);
  __l_01._M_len = local_230;
  __l_01._M_array = local_238;
  CLI::std::vector<int,_std::allocator<int>_>::vector(&local_228,__l_01,&local_245);
  testing::internal::EqHelper<false>::
  Compare<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
            ((EqHelper<false> *)local_210,"st1","std::vector<int>({1, 3, 4})",
             (vector<int,_std::allocator<int>_> *)&op1,&local_228);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(&local_228);
  CLI::std::allocator<int>::~allocator(&local_245);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_250);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x3d3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  local_294 = 2;
  local_290 = &local_294;
  local_288 = 1;
  CLI::std::allocator<int>::allocator(&local_295);
  __l_00._M_len = local_288;
  __l_00._M_array = local_290;
  CLI::std::vector<int,_std::allocator<int>_>::vector(&local_280,__l_00,&local_295);
  testing::internal::EqHelper<false>::
  Compare<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
            ((EqHelper<false> *)local_268,"st2","std::vector<int>({2})",
             (vector<int,_std::allocator<int>_> *)&op2,&local_280);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(&local_280);
  CLI::std::allocator<int>::~allocator(&local_295);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar1) {
    testing::Message::Message(&local_2a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x3d4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_2a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  lhs = CLI::App::parse_order(&(this->super_TApp).app);
  local_300 = local_30;
  local_2f8 = local_b0;
  local_2f0 = local_30;
  local_2e8 = local_30;
  local_2e0 = &local_300;
  local_2d8 = 4;
  CLI::std::allocator<CLI::Option_*>::allocator(&local_301);
  __l._M_len = local_2d8;
  __l._M_array = local_2e0;
  CLI::std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::vector(&local_2d0,__l,&local_301)
  ;
  testing::internal::EqHelper<false>::
  Compare<std::vector<CLI::Option*,std::allocator<CLI::Option*>>,std::vector<CLI::Option*,std::allocator<CLI::Option*>>>
            ((EqHelper<false> *)local_2b8,"app.parse_order()",
             "std::vector<CLI::Option *>({op1, op2, op1, op1})",lhs,&local_2d0);
  CLI::std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::~vector(&local_2d0);
  CLI::std::allocator<CLI::Option_*>::~allocator(&local_301);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar1) {
    testing::Message::Message(&local_310);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x3d6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_318,&local_310);
    testing::internal::AssertHelper::~AssertHelper(&local_318);
    testing::Message::~Message(&local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  CLI::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&op2);
  CLI::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&op1);
  return;
}

Assistant:

TEST_F(TApp, OriginalOrder) {
    std::vector<int> st1;
    CLI::Option *op1 = app.add_option("-a", st1);
    std::vector<int> st2;
    CLI::Option *op2 = app.add_option("-b", st2);

    args = {"-a", "1", "-b", "2", "-a3", "-a", "4"};

    run();

    EXPECT_EQ(st1, std::vector<int>({1, 3, 4}));
    EXPECT_EQ(st2, std::vector<int>({2}));

    EXPECT_EQ(app.parse_order(), std::vector<CLI::Option *>({op1, op2, op1, op1}));
}